

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O3

string * __thiscall
bsim::quad_value::binary_string_abi_cxx11_(string *__return_storage_ptr__,quad_value *this)

{
  char *pcVar1;
  char *pcVar2;
  
  switch(this->value) {
  case '\0':
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "0";
    pcVar1 = "";
    break;
  case '\x01':
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "1";
    pcVar1 = "";
    break;
  case '\x02':
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "x";
    pcVar1 = "";
    break;
  case '\x03':
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "z";
    pcVar1 = "";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x86,"std::string bsim::quad_value::binary_string() const");
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string binary_string() const {
      if (value == 1) {
        return "1";
      } else if (value == 0) {
        return "0";
      } else if (value == QBV_UNKNOWN_VALUE) {
        return "x";
      } else if (value == QBV_HIGH_IMPEDANCE_VALUE) {
        return "z";
      }
      assert(false);
    }